

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2Bug1816809(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_2b0;
  string *local_130;
  string local_128 [8];
  string x;
  undefined1 local_f8 [8];
  StringPiece piece;
  RE2 re;
  
  RE2::RE2((RE2 *)&piece.length_,"(((((llx((-3)|(4)))(;(llx((-3)|(4))))*))))");
  StringPiece::StringPiece((StringPiece *)local_f8,"llx-3;llx4");
  std::__cxx11::string::string(local_128);
  local_130 = local_128;
  bVar1 = RE2::Consume<std::__cxx11::string*>
                    ((StringPiece *)local_f8,(RE2 *)&piece.length_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_130);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c1);
    poVar2 = LogMessage::stream(&local_2b0);
    std::operator<<(poVar2,"Check failed: RE2::Consume(&piece, re, &x)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  std::__cxx11::string::~string(local_128);
  RE2::~RE2((RE2 *)&piece.length_);
  return;
}

Assistant:

TEST(RE2, Bug1816809) {
  RE2 re("(((((llx((-3)|(4)))(;(llx((-3)|(4))))*))))");
  StringPiece piece("llx-3;llx4");
  string x;
  EXPECT_TRUE(RE2::Consume(&piece, re, &x));
}